

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O2

int32_t __thiscall
charls::jls_codec<charls::lossless_traits<unsigned_char,_8>,_charls::encoder_strategy>::do_run_mode
          (jls_codec<charls::lossless_traits<unsigned_char,_8>,_charls::encoder_strategy> *this,
          int32_t index,encoder_strategy *param_2)

{
  byte bVar1;
  pixel_type *ppVar2;
  pixel_type *ppVar3;
  sample_type sVar4;
  int iVar5;
  uint run_length;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  
  uVar8 = this->width_ - index;
  ppVar2 = this->current_line_;
  ppVar3 = this->previous_line_;
  bVar1 = ppVar2[(long)index + -1];
  uVar6 = 0;
  do {
    uVar7 = uVar6;
    if (ppVar2[uVar6 + (long)index] != bVar1) break;
    uVar6 = uVar6 + 1;
    uVar7 = (ulong)uVar8;
  } while (uVar8 != uVar6);
  run_length = (uint)uVar7;
  encode_run_pixels(this,run_length,run_length == uVar8);
  if (run_length != uVar8) {
    sVar4 = encode_run_interruption_pixel
                      (this,(uint)ppVar2[(long)(int)run_length + (long)index],(uint)bVar1,
                       (uint)ppVar3[(long)(int)run_length + (long)index]);
    ppVar2[(long)(int)run_length + (long)index] = sVar4;
    iVar5 = 1;
    if (1 < this->run_index_) {
      iVar5 = this->run_index_;
    }
    this->run_index_ = iVar5 + -1;
    uVar8 = run_length + 1;
  }
  return uVar8;
}

Assistant:

int32_t do_run_mode(const int32_t index, encoder_strategy* /*strategy*/)
    {
        const int32_t count_type_remain = width_ - index;
        pixel_type* type_cur_x{current_line_ + index};
        const pixel_type* type_prev_x{previous_line_ + index};

        const pixel_type ra{type_cur_x[-1]};

        int32_t run_length{};
        while (traits_.is_near(type_cur_x[run_length], ra))
        {
            type_cur_x[run_length] = ra;
            ++run_length;

            if (run_length == count_type_remain)
                break;
        }

        encode_run_pixels(run_length, run_length == count_type_remain);

        if (run_length == count_type_remain)
            return run_length;

        type_cur_x[run_length] = encode_run_interruption_pixel(type_cur_x[run_length], ra, type_prev_x[run_length]);
        decrement_run_index();
        return run_length + 1;
    }